

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall
t_php_generator::generate_process_function
          (t_php_generator *this,ostream *out,t_service *tservice,t_function *tfunction)

{
  string *__rhs;
  int *piVar1;
  t_struct *ptVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ostream *poVar6;
  t_type *ptVar7;
  undefined4 extraout_var;
  pointer pptVar8;
  string resultname;
  string argsname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_168;
  t_function *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  t_struct *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_148 = tfunction;
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&local_70);
  poVar6 = std::operator<<(poVar6,"protected function process_");
  local_140 = &local_148->name_;
  poVar6 = std::operator<<(poVar6,(string *)local_140);
  poVar6 = std::operator<<(poVar6,"($seqid, $input, $output)");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_d0);
  poVar6 = std::operator<<(poVar6,"{");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  php_namespace_abi_cxx11_(&local_118,this,(tservice->super_t_type).program_);
  __rhs = &(this->super_t_oop_generator).super_t_generator.service_name_;
  std::operator+(&local_138,&local_118,__rhs);
  std::operator+(&bStack_168,&local_138,"_");
  std::operator+(&local_d0,&bStack_168,local_140);
  std::operator+(&local_70,&local_d0,"_args");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&bStack_168);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  php_namespace_abi_cxx11_(&local_f0,this,(tservice->super_t_type).program_);
  std::operator+(&local_118,&local_f0,__rhs);
  std::operator+(&local_138,&local_118,"_");
  std::operator+(&bStack_168,&local_138,local_140);
  std::operator+(&local_d0,&bStack_168,"_result");
  std::__cxx11::string::~string((string *)&bStack_168);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f0);
  t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&bStack_168);
  poVar6 = std::operator<<(poVar6,"$bin_accel = ($input instanceof ");
  poVar6 = std::operator<<(poVar6,
                           "TBinaryProtocolAccelerated) && function_exists(\'thrift_protocol_read_binary_after_message_begin\');"
                          );
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_168);
  t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&bStack_168);
  poVar6 = std::operator<<(poVar6,"if ($bin_accel) {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_168);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&bStack_168);
  poVar6 = std::operator<<(poVar6,"$args = thrift_protocol_read_binary_after_message_begin(");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_168);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&bStack_168);
  poVar6 = std::operator<<(poVar6,"$input,");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_138);
  poVar6 = std::operator<<(poVar6,"\'");
  poVar6 = std::operator<<(poVar6,(string *)&local_70);
  poVar6 = std::operator<<(poVar6,"\',");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_118);
  poVar6 = std::operator<<(poVar6,"$input->isStrictRead()");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&bStack_168);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&bStack_168);
  poVar6 = std::operator<<(poVar6,");");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_168);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&bStack_168);
  poVar6 = std::operator<<(poVar6,"} else {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_168);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&bStack_168);
  poVar6 = std::operator<<(poVar6,"$args = new ");
  poVar6 = std::operator<<(poVar6,(string *)&local_70);
  poVar6 = std::operator<<(poVar6,"();");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_138);
  poVar6 = std::operator<<(poVar6,"$args->read($input);");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&bStack_168);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&bStack_168);
  poVar6 = std::operator<<(poVar6,"}");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_168);
  if (this->binary_inline_ == false) {
    t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&bStack_168);
    poVar6 = std::operator<<(poVar6,"$input->readMessageEnd();");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&bStack_168);
  }
  local_f8 = local_148->xceptions_;
  if (local_148->oneway_ == false) {
    t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&bStack_168);
    poVar6 = std::operator<<(poVar6,"$result = new ");
    poVar6 = std::operator<<(poVar6,(string *)&local_d0);
    poVar6 = std::operator<<(poVar6,"();");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&bStack_168);
  }
  if ((local_f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&bStack_168);
    poVar6 = std::operator<<(poVar6,"try {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&bStack_168);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
  }
  ptVar2 = local_148->arglist_;
  t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
  std::operator<<(out,(string *)&bStack_168);
  std::__cxx11::string::~string((string *)&bStack_168);
  if (local_148->oneway_ == false) {
    iVar5 = (*(local_148->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar5 == '\0') {
      std::operator<<(out,"$result->success = ");
    }
  }
  poVar6 = std::operator<<(out,"$this->handler_->");
  poVar6 = std::operator<<(poVar6,(string *)local_140);
  std::operator<<(poVar6,"(");
  bVar3 = true;
  for (pptVar8 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar8 !=
      (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
    if (!bVar3) {
      std::operator<<(out,", ");
    }
    poVar6 = std::operator<<(out,"$args->");
    std::operator<<(poVar6,(string *)&(*pptVar8)->name_);
    bVar3 = false;
  }
  poVar6 = std::operator<<(out,");");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  bVar4 = local_148->oneway_;
  if (((bool)bVar4 == false) &&
     (pptVar8 = (local_f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     (local_f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
     super__Vector_impl_data._M_finish != pptVar8)) {
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    for (; pptVar8 !=
           (local_f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
           super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
      t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
      poVar6 = std::operator<<(out,(string *)&bStack_168);
      poVar6 = std::operator<<(poVar6,"} catch (");
      ptVar7 = t_type::get_true_type((*pptVar8)->type_);
      php_namespace_abi_cxx11_(&local_138,this,ptVar7->program_);
      poVar6 = std::operator<<(poVar6,(string *)&local_138);
      iVar5 = (*((*pptVar8)->type_->super_t_doc)._vptr_t_doc[3])();
      poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var,iVar5));
      poVar6 = std::operator<<(poVar6," $");
      poVar6 = std::operator<<(poVar6,(string *)&(*pptVar8)->name_);
      poVar6 = std::operator<<(poVar6,") {");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&bStack_168);
      if (local_148->oneway_ == false) {
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
        poVar6 = std::operator<<(out,(string *)&bStack_168);
        poVar6 = std::operator<<(poVar6,"$result->");
        poVar6 = std::operator<<(poVar6,(string *)&(*pptVar8)->name_);
        poVar6 = std::operator<<(poVar6," = $");
        poVar6 = std::operator<<(poVar6,(string *)&(*pptVar8)->name_);
        poVar6 = std::operator<<(poVar6,";");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&bStack_168);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
        std::operator<<(out,(string *)&bStack_168);
        std::__cxx11::string::~string((string *)&bStack_168);
      }
    }
    poVar6 = std::operator<<(out,"}");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    bVar4 = local_148->oneway_;
  }
  if ((bVar4 & 1) == 0) {
    t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&bStack_168);
    poVar6 = std::operator<<(poVar6,"$bin_accel = ($output instanceof ");
    poVar6 = std::operator<<(poVar6,
                             "TBinaryProtocolAccelerated) && function_exists(\'thrift_protocol_write_binary\');"
                            );
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&bStack_168);
    t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&bStack_168);
    poVar6 = std::operator<<(poVar6,"if ($bin_accel) {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&bStack_168);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&bStack_168);
    poVar6 = std::operator<<(poVar6,"thrift_protocol_write_binary(");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&bStack_168);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&bStack_168);
    poVar6 = std::operator<<(poVar6,"$output,");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_138);
    poVar6 = std::operator<<(poVar6,"\'");
    poVar6 = std::operator<<(poVar6,(string *)local_140);
    poVar6 = std::operator<<(poVar6,"\',");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_118);
    poVar6 = std::operator<<(poVar6,"TMessageType::REPLY,");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_f0);
    poVar6 = std::operator<<(poVar6,"$result,");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_90);
    poVar6 = std::operator<<(poVar6,"$seqid,");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_b0);
    poVar6 = std::operator<<(poVar6,"$output->isStrictWrite()");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&bStack_168);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&bStack_168);
    poVar6 = std::operator<<(poVar6,");");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&bStack_168);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&bStack_168);
    poVar6 = std::operator<<(poVar6,"} else {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&bStack_168);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    if (this->binary_inline_ == true) {
      t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
      poVar6 = std::operator<<(out,(string *)&bStack_168);
      poVar6 = std::operator<<(poVar6,"$buff = pack(\'N\', (0x80010000 | ");
      poVar6 = std::operator<<(poVar6,"TMessageType::REPLY)); ");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_138);
      poVar6 = std::operator<<(poVar6,"$buff .= pack(\'N\', strlen(\'");
      poVar6 = std::operator<<(poVar6,(string *)local_140);
      poVar6 = std::operator<<(poVar6,"\'));");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_118);
      poVar6 = std::operator<<(poVar6,"$buff .= \'");
      poVar6 = std::operator<<(poVar6,(string *)local_140);
      poVar6 = std::operator<<(poVar6,"\';");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_f0);
      poVar6 = std::operator<<(poVar6,"$buff .= pack(\'N\', $seqid);");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_90);
      poVar6 = std::operator<<(poVar6,"$result->write($buff);");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_b0);
      poVar6 = std::operator<<(poVar6,"$output->write($buff);");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_50);
      poVar6 = std::operator<<(poVar6,"$output->flush();");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
      poVar6 = std::operator<<(out,(string *)&bStack_168);
      poVar6 = std::operator<<(poVar6,"$output->writeMessageBegin(\'");
      poVar6 = std::operator<<(poVar6,(string *)local_140);
      poVar6 = std::operator<<(poVar6,"\', ");
      poVar6 = std::operator<<(poVar6,"TMessageType::REPLY, $seqid);");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_138);
      poVar6 = std::operator<<(poVar6,"$result->write($output);");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_118);
      poVar6 = std::operator<<(poVar6,"$output->writeMessageEnd();");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_f0);
      poVar6 = std::operator<<(poVar6,"$output->getTransport()->flush();");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&bStack_168);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&bStack_168);
    poVar6 = std::operator<<(poVar6,"}");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&bStack_168);
    poVar6 = std::operator<<(poVar6,"return;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&bStack_168);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&bStack_168,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&bStack_168);
    poVar6 = std::operator<<(poVar6,"}");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&bStack_168);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void t_php_generator::generate_process_function(std::ostream& out, t_service* tservice, t_function* tfunction) {
  // Open function
  out << indent() << "protected function process_" << tfunction->get_name() << "($seqid, $input, $output)" << endl
      << indent() << "{" << endl;
  indent_up();

  string argsname = php_namespace(tservice->get_program()) + service_name_ + "_"
                    + tfunction->get_name() + "_args";
  string resultname = php_namespace(tservice->get_program()) + service_name_ + "_"
                      + tfunction->get_name() + "_result";

  out << indent() << "$bin_accel = ($input instanceof "
             << "TBinaryProtocolAccelerated) && function_exists('thrift_protocol_read_binary_after_message_begin');"
             << endl;
  out << indent() << "if ($bin_accel) {" << endl;
  indent_up();

  out << indent() << "$args = thrift_protocol_read_binary_after_message_begin(" <<endl;

  indent_up();
  out << indent() << "$input,"<<endl
      << indent() << "'" << argsname << "'," << endl
      << indent() << "$input->isStrictRead()" <<endl;

  indent_down();
  out << indent() <<");" << endl;

  indent_down();
  out << indent() << "} else {" << endl;

  indent_up();
  out << indent() << "$args = new " << argsname << "();" << endl
      << indent() << "$args->read($input);" << endl;

  indent_down();
  out << indent() << "}" << endl;

  if (!binary_inline_) {
    out << indent() << "$input->readMessageEnd();" << endl;
  }

  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;

  // Declare result for non oneway function
  if (!tfunction->is_oneway()) {
    out << indent() << "$result = new " << resultname << "();" << endl;
  }

  // Try block for a function with exceptions
  if (xceptions.size() > 0) {
    out << indent() << "try {" << endl;
    indent_up();
  }

  // Generate the function call
  t_struct* arg_struct = tfunction->get_arglist();
  const std::vector<t_field*>& fields = arg_struct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << indent();
  if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
    out << "$result->success = ";
  }
  out << "$this->handler_->" << tfunction->get_name() << "(";
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      out << ", ";
    }
    out << "$args->" << (*f_iter)->get_name();
  }
  out << ");" << endl;

  if (!tfunction->is_oneway() && xceptions.size() > 0) {
    indent_down();
    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      out << indent() << "} catch ("
                 << php_namespace(get_true_type((*x_iter)->get_type())->get_program())
                 << (*x_iter)->get_type()->get_name() << " $" << (*x_iter)->get_name() << ") {"
                 << endl;
      if (!tfunction->is_oneway()) {
        indent_up();
        out << indent() << "$result->" << (*x_iter)->get_name() << " = $"
                   << (*x_iter)->get_name() << ";" << endl;
        indent_down();
        out << indent();
      }
    }
    out << "}" << endl;
  }

  // Shortcut out here for oneway functions
  if (tfunction->is_oneway()) {
    out << indent() << "return;" << endl;
    indent_down();
    out << indent() << "}" << endl;
    return;
  }

  out << indent() << "$bin_accel = ($output instanceof "
             << "TBinaryProtocolAccelerated) && function_exists('thrift_protocol_write_binary');"
             << endl;

  out << indent() << "if ($bin_accel) {" << endl;
  indent_up();

  out << indent() << "thrift_protocol_write_binary(" << endl;

  indent_up();
  out << indent() << "$output,"<<endl
      << indent() << "'" << tfunction->get_name()<< "'," <<endl
      << indent() << "TMessageType::REPLY,"<< endl
      << indent() << "$result," << endl
      << indent() << "$seqid," << endl
      << indent() << "$output->isStrictWrite()"<<endl;

  indent_down();
  out << indent() << ");" << endl;

  indent_down();
  out << indent() << "} else {" << endl;
  indent_up();

  // Serialize the request header
  if (binary_inline_) {
    out << indent() << "$buff = pack('N', (0x80010000 | "
        << "TMessageType::REPLY)); " << endl << indent() << "$buff .= pack('N', strlen('"
        << tfunction->get_name() << "'));" << endl << indent() << "$buff .= '"
        << tfunction->get_name() << "';" << endl << indent() << "$buff .= pack('N', $seqid);"
        << endl << indent() << "$result->write($buff);" << endl << indent()
        << "$output->write($buff);" << endl << indent() << "$output->flush();" << endl;
  } else {
    out << indent() << "$output->writeMessageBegin('" << tfunction->get_name() << "', "
        << "TMessageType::REPLY, $seqid);" << endl << indent() << "$result->write($output);"
        << endl << indent() << "$output->writeMessageEnd();" << endl << indent()
        << "$output->getTransport()->flush();" << endl;
  }

  scope_down(out);

  // Close function
  indent_down();
  out << indent() << "}" << endl;
}